

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ptr<Expression> __thiscall Parser::variable(Parser *this)

{
  _Alloc_hider _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Parser *in_RSI;
  ptr<Expression> pVar2;
  Identifier ident;
  undefined1 local_48 [8];
  _Alloc_hider _Stack_40;
  undefined1 local_38 [40];
  
  Token::Token((Token *)local_48,&in_RSI->currentToken);
  ident._M_dataplus._M_p = (pointer)&ident.field_2;
  if (_Stack_40._M_p == local_38 + 8) {
    ident.field_2._8_8_ = local_38._16_8_;
  }
  else {
    ident._M_dataplus._M_p = _Stack_40._M_p;
  }
  ident._M_string_length = local_38._0_8_;
  local_38._0_8_ = 0;
  local_38[8] = '\0';
  _Stack_40._M_p = local_38 + 8;
  std::__cxx11::string::~string((string *)&_Stack_40);
  consume(in_RSI,Identifier,"identifier");
  std::make_shared<Symbol,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  _Var1._M_p = _Stack_40._M_p;
  _Stack_40._M_p = (pointer)0x0;
  (this->filepath)._M_dataplus._M_p = (pointer)local_48;
  (this->filepath)._M_string_length = (size_type)_Var1._M_p;
  local_48 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_40);
  std::__cxx11::string::~string((string *)&ident);
  pVar2.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar2.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar2.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::variable() {
    Identifier ident = token().lexeme;
    consume(TokenType::Identifier, "identifier");
    ptr<Expression> expr = make<Symbol>(ident);
    return expr;
}